

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_84eae::data<Imath_3_2::half>::setUpFrameBuffer
          (data<Imath_3_2::half> *this,
          vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Slice *pSVar4;
  int iVar5;
  pointer pbVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  pointer pbVar11;
  Slice local_68 [56];
  
  iVar5 = (dw->max).x;
  iVar1 = (dw->min).x;
  iVar2 = (dw->max).y;
  iVar3 = (dw->min).y;
  lVar10 = (long)((iVar5 - iVar1) + 1);
  if (iVar2 < iVar3 || iVar5 < iVar1) {
    lVar10 = 1;
  }
  lVar8 = (long)((iVar2 - iVar3) + 1);
  if (iVar2 < iVar3 || iVar5 < iVar1) {
    lVar8 = 1;
  }
  std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::resize
            (data,lVar10 * ((long)(this->_channels).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->_channels).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) * lVar8);
  pbVar11 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar11) {
    lVar8 = 0;
    lVar10 = 0;
    uVar9 = 0;
    do {
      if (dontbotherloadingdepth) {
        iVar5 = std::__cxx11::string::compare((char *)((long)&(pbVar11->_M_dataplus)._M_p + lVar10))
        ;
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((long)&(((this->_channels).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10));
          if (iVar5 != 0) {
            pbVar11 = (this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar6 = (this->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_00138a37;
          }
        }
      }
      else {
LAB_00138a37:
        pSVar4 = *(Slice **)((long)&(pbVar11->_M_dataplus)._M_p + lVar10);
        iVar1 = (dw->min).x;
        iVar2 = (dw->min).y;
        iVar3 = (dw->max).x;
        iVar5 = (iVar3 - iVar1) + 1;
        if ((dw->max).y < iVar2) {
          iVar5 = 1;
        }
        if (iVar3 < iVar1) {
          iVar5 = 1;
        }
        uVar7 = (long)pbVar6 - (long)pbVar11 >> 4;
        Imf_3_2::Slice::Slice
                  (local_68,this->_type,
                   (char *)((long)(data->
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                           (lVar8 - (long)(iVar2 * iVar5 + iVar1) * uVar7)),uVar7,
                   (long)iVar5 * ((long)pbVar6 - (long)pbVar11 >> 5) * 2,1,1,0.0,false,false);
        Imf_3_2::FrameBuffer::insert((char *)framebuf,pSVar4);
      }
      uVar9 = uVar9 + 1;
      pbVar11 = (this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->_channels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar10 = lVar10 + 0x20;
      lVar8 = lVar8 + 2;
    } while (uVar9 < (ulong)((long)pbVar6 - (long)pbVar11 >> 5));
  }
  return;
}

Assistant:

void setUpFrameBuffer (
        vector<T>&   data,
        FrameBuffer& framebuf,
        const Box2i& dw,
        bool         dontbotherloadingdepth) const
    {

        // allocate enough space for all channels (even the depth channel)
        data.resize (
            _channels.size () * (dw.size ().x + 1) * (dw.size ().y + 1));
        for (size_t i = 0; i < _channels.size (); i++)
        {
            if (!dontbotherloadingdepth ||
                (_channels[i] != "Z" && _channels[i] != "ZBack"))
            {
                intptr_t base = reinterpret_cast<intptr_t> (&data[i]);
                framebuf.insert (
                    _channels[i].c_str (),
                    Slice (
                        _type,
                        reinterpret_cast<char*> (
                            base -
                            sizeof (T) *
                                (dw.min.x + dw.min.y * (dw.size ().x + 1)) *
                                _channels.size ()),
                        sizeof (T) * _channels.size (),
                        sizeof (T) * (dw.size ().x + 1) * _channels.size ()));
            }
        }
    }